

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O0

int numroots(int np,poly *sseq,int *atneg,int *atpos,bool non_neg)

{
  double *pdVar1;
  int *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  int in_EDI;
  byte in_R8B;
  poly *s;
  double lf;
  double f;
  int atneginf;
  int atposinf;
  uint *local_48;
  double local_40;
  double local_38;
  uint in_stack_ffffffffffffffd0;
  int iVar2;
  int iVar3;
  undefined3 in_stack_ffffffffffffffdc;
  
  iVar3 = 0;
  iVar2 = 0;
  local_40 = *(double *)(in_RSI + (long)(int)*in_RSI * 2 + 2);
  for (local_48 = in_RSI + 0x84; local_48 <= in_RSI + (long)in_EDI * 0x84;
      local_48 = local_48 + 0x84) {
    pdVar1 = (double *)(local_48 + (long)(int)*local_48 * 2 + 2);
    if (((local_40 == 0.0) && (!NAN(local_40))) || (local_40 * *pdVar1 < 0.0)) {
      iVar3 = iVar3 + 1;
    }
    local_40 = *pdVar1;
  }
  if ((in_R8B & 1) == 0) {
    if ((*in_RSI & 1) == 0) {
      local_40 = *(double *)(in_RSI + (long)(int)*in_RSI * 2 + 2);
    }
    else {
      local_40 = -*(double *)(in_RSI + (long)(int)*in_RSI * 2 + 2);
    }
    for (local_48 = in_RSI + 0x84; local_48 <= in_RSI + (long)in_EDI * 0x84;
        local_48 = local_48 + 0x84) {
      if ((*local_48 & 1) == 0) {
        local_38 = *(double *)(local_48 + (long)(int)*local_48 * 2 + 2);
      }
      else {
        local_38 = -*(double *)(local_48 + (long)(int)*local_48 * 2 + 2);
      }
      if (((local_40 == 0.0) && (!NAN(local_40))) || (local_40 * local_38 < 0.0)) {
        iVar2 = iVar2 + 1;
      }
      local_40 = local_38;
    }
  }
  else {
    iVar2 = numchanges((int)((ulong)in_RCX >> 0x20),
                       (poly *)(CONCAT44(CONCAT13(in_R8B,in_stack_ffffffffffffffdc),iVar3) &
                               0x1ffffffffffffff),(double)(ulong)in_stack_ffffffffffffffd0);
  }
  *in_RDX = iVar2;
  *in_RCX = iVar3;
  return iVar2 - iVar3;
}

Assistant:

int numroots(int np, poly *sseq, int *atneg, int *atpos, bool non_neg)
   {
   int atposinf = 0;
   int atneginf = 0;

   /* changes at positive infinity */
   double f;
   double lf = sseq[0].coef[sseq[0].ord];

   poly *s;
   for (s = sseq + 1; s <= sseq + np; s++) {
      f = s->coef[s->ord];
      if (lf == 0.0 || lf * f < 0)
         atposinf++;
      lf = f;
      }

   // changes at negative infinity or zero
   if (non_neg)
      atneginf = numchanges(np, sseq, 0.0);

   else
      {
      if (sseq[0].ord & 1)
         lf = -sseq[0].coef[sseq[0].ord];
      else
         lf = sseq[0].coef[sseq[0].ord];

      for (s = sseq + 1; s <= sseq + np; s++) {
         if (s->ord & 1)
            f = -s->coef[s->ord];
         else
            f = s->coef[s->ord];
         if (lf == 0.0 || lf * f < 0)
            atneginf++;
         lf = f;
         }
      }

   *atneg = atneginf;
   *atpos = atposinf;

   return(atneginf - atposinf);
   }